

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-ransom-note.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  istream *this;
  ostream *poVar2;
  byte bVar3;
  int i;
  int iVar4;
  char *pcVar5;
  int i_1;
  int n;
  int m;
  string word;
  Trie trie;
  int local_1f8;
  int local_1f4;
  string local_1f0;
  Trie local_1d0;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_1f4);
  std::istream::operator>>(this,&local_1f8);
  memset(&local_1d0,0,0x1a8);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  for (iVar4 = 0; iVar4 < local_1f4; iVar4 = iVar4 + 1) {
    std::operator>>((istream *)&std::cin,(string *)&local_1f0);
    Trie::add(&local_1d0,&local_1f0);
  }
  bVar3 = 1;
  for (iVar4 = 0; iVar4 < local_1f8; iVar4 = iVar4 + 1) {
    std::operator>>((istream *)&std::cin,(string *)&local_1f0);
    bVar1 = Trie::use(&local_1d0,&local_1f0);
    bVar3 = bVar3 & bVar1;
  }
  pcVar5 = "No";
  if (bVar3 != 0) {
    pcVar5 = "Yes";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_1f0);
  Trie::~Trie(&local_1d0);
  return 0;
}

Assistant:

int main() {
  int m, n;
  std::cin >> m >> n;
  Trie trie;
  std::string word;
  for (int i = 0; i < m; ++i) {
    std::cin >> word;
    trie.add(word);
  }
  bool doable = true;
  for (int i = 0; i < n; ++i) {
    std::cin >> word;
    doable &= trie.use(word);
  }
  std::cout << (doable ? "Yes" : "No") << std::endl;
}